

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_3cfdbb::ArgParser::argEndAttachment(ArgParser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  QPDFJob::AttConfig::endAddAttachment
            ((this->c_att).super___shared_ptr<QPDFJob::AttConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  this_00 = (this->c_att).super___shared_ptr<QPDFJob::AttConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->c_att).super___shared_ptr<QPDFJob::AttConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->c_att).super___shared_ptr<QPDFJob::AttConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

void
ArgParser::argEndAttachment()
{
    c_att->endAddAttachment();
    c_att = nullptr;
}